

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::CallMetaMethod
          (SQVM *this,SQObjectPtr *closure,SQMetaMethod mm,SQInteger nparams,SQObjectPtr *outres)

{
  bool bVar1;
  SQInteger in_RCX;
  undefined4 in_EDX;
  long in_RDI;
  SQBool in_stack_00000030;
  SQObjectPtr *in_stack_00000038;
  SQInteger in_stack_00000040;
  SQInteger in_stack_00000048;
  SQObjectPtr *in_stack_00000050;
  SQVM *in_stack_00000058;
  undefined4 in_stack_ffffffffffffffe0;
  
  *(long *)(in_RDI + 0x128) = *(long *)(in_RDI + 0x128) + 1;
  bVar1 = Call(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
               in_stack_00000038,in_stack_00000030);
  if (bVar1) {
    *(long *)(in_RDI + 0x128) = *(long *)(in_RDI + 0x128) + -1;
    Pop((SQVM *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX);
  }
  else {
    *(long *)(in_RDI + 0x128) = *(long *)(in_RDI + 0x128) + -1;
    Pop((SQVM *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX);
  }
  return bVar1;
}

Assistant:

bool SQVM::CallMetaMethod(SQObjectPtr &closure,SQMetaMethod SQ_UNUSED_ARG(mm),SQInteger nparams,SQObjectPtr &outres)
{
    //SQObjectPtr closure;

    _nmetamethodscall++;
    if(Call(closure, nparams, _top - nparams, outres, SQFalse)) {
        _nmetamethodscall--;
        Pop(nparams);
        return true;
    }
    _nmetamethodscall--;
    //}
    Pop(nparams);
    return false;
}